

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O3

BYTE __thiscall EncoderMD::GetMod(EncoderMD *this,size_t offset,bool regIsRbpOrR13,int *pDispSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (offset == 0) {
    if (!regIsRbpOrR13) {
      *pDispSize = 0;
      return '\0';
    }
  }
  else if ((long)(char)offset != offset) {
    if ((long)(int)offset == offset) {
      *pDispSize = 4;
      return 0x80;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x121,"(0)","Cannot encode offsets more than 32 bits in MODRM");
    if (bVar2) {
      *puVar3 = 0;
      return 0xff;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *pDispSize = 1;
  return '@';
}

Assistant:

BYTE
EncoderMD::GetMod(size_t offset, bool regIsRbpOrR13, int * pDispSize)
{
    if (offset == 0 && !regIsRbpOrR13)
    {
        *(pDispSize) = 0;
        return Mod00;
    }
    else if (this->FitsInByte(offset))
    {
        *(pDispSize) = 1;
        return Mod01;
    }
    else if(Math::FitsInDWord(offset))
    {
        *(pDispSize) = 4;
        return Mod10;
    }
    else
    {
        AssertMsg(0, "Cannot encode offsets more than 32 bits in MODRM");
        return 0xff;
    }
}